

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::Demangle(char *mangled,char *out,size_t out_size)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  byte bVar7;
  State local_40;
  
  local_40.out_end = out + out_size;
  local_40.prev_name = (char *)0x0;
  local_40.prev_name_length = -1;
  local_40.nest_level = -1;
  local_40.append = true;
  local_40.overflowed = false;
  if ((*mangled == '_') && (mangled[1] == 'Z')) {
    local_40.mangled_cur = mangled + 2;
    local_40.out_cur = out;
    local_40.out_begin = out;
    bVar4 = ParseEncoding(&local_40);
    if (bVar4) {
      bVar7 = 1;
      cVar1 = *local_40.mangled_cur;
      if (cVar1 == '\0') goto LAB_00129cef;
      if (cVar1 == '@') {
        MaybeAppend(&local_40,local_40.mangled_cur);
        goto LAB_00129cef;
      }
      if (cVar1 == '.') {
        lVar5 = 0;
        pcVar6 = local_40.mangled_cur;
        do {
          if (0x19 < (byte)((pcVar6[1] & 0xdfU) + 0xbf)) goto LAB_00129ced;
          lVar2 = lVar5 + 3;
          pcVar3 = local_40.mangled_cur + lVar5 + 3;
          do {
            pcVar6 = pcVar3;
            lVar5 = lVar2;
            lVar2 = lVar5 + 1;
            pcVar3 = pcVar6 + 1;
          } while ((byte)((local_40.mangled_cur[lVar5 + -1] & 0xdfU) + 0xbf) < 0x1a);
          if ((local_40.mangled_cur[lVar5 + -1] != 0x2e) ||
             (9 < (byte)(local_40.mangled_cur[lVar5] - 0x30U))) goto LAB_00129ced;
          do {
            cVar1 = pcVar6[1];
            pcVar6 = pcVar6 + 1;
            lVar5 = lVar5 + 1;
          } while ((byte)(cVar1 - 0x30U) < 10);
        } while (cVar1 == '.');
        if (cVar1 == '\0') goto LAB_00129cef;
      }
    }
  }
LAB_00129ced:
  bVar7 = 0;
LAB_00129cef:
  return (bool)((local_40.overflowed ^ 1U) & bVar7);
}

Assistant:

bool Demangle(const char *mangled, char *out, size_t out_size) {
#if defined(GLOG_OS_WINDOWS)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char *lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char *rparen = strchr(lparen, ')');
    size_t length = static_cast<size_t>(rparen - lparen) - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  } // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}